

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleiter.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RuleCharacterIterator::lookahead
          (RuleCharacterIterator *this,UnicodeString *result,int32_t maxLookAhead)

{
  UnicodeString *this_00;
  int32_t start;
  int32_t local_1c;
  int32_t maxLookAhead_local;
  UnicodeString *result_local;
  RuleCharacterIterator *this_local;
  
  local_1c = maxLookAhead;
  if (maxLookAhead < 0) {
    local_1c = 0x7fffffff;
  }
  if (this->buf == (UnicodeString *)0x0) {
    this_00 = this->text;
    start = ParsePosition::getIndex(this->pos);
    UnicodeString::extract(this_00,start,local_1c,result);
  }
  else {
    UnicodeString::extract(this->buf,this->bufPos,local_1c,result);
  }
  return result;
}

Assistant:

UnicodeString& RuleCharacterIterator::lookahead(UnicodeString& result, int32_t maxLookAhead) const {
    if (maxLookAhead < 0) {
        maxLookAhead = 0x7FFFFFFF;
    }
    if (buf != 0) {
        buf->extract(bufPos, maxLookAhead, result);
    } else {
        text.extract(pos.getIndex(), maxLookAhead, result);
    }
    return result;
}